

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

cmCPackComponent * __thiscall
cmCPackGenerator::GetComponent(cmCPackGenerator *this,string *projectName,string *name)

{
  pointer *pppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator iVar3;
  size_type sVar4;
  cmCPackComponent *pcVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  const_iterator cVar10;
  long *plVar11;
  cmValue cVar12;
  string *psVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar15;
  char *extraout_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string *installType;
  _Alloc_hider _Var16;
  string_view value;
  string_view arg;
  string_view arg_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cmCPackComponent *component;
  string macroPrefix;
  cmCPackComponent *child;
  string local_a8;
  cmCPackComponent *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  cmCPackComponent *local_58;
  string local_50;
  cmCPackComponentGroup *pcVar14;
  
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
           ::find(&(this->Components)._M_t,name);
  local_80 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
             ::operator[](&this->Components,name);
  if ((_Rb_tree_header *)cVar10._M_node == &(this->Components)._M_t._M_impl.super__Rb_tree_header) {
    cmsys::SystemTools::UpperCase(&local_a8,name);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x6dd2e8);
    local_78 = &local_68;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_68 = *plVar15;
      lStack_60 = plVar11[3];
    }
    else {
      local_68 = *plVar15;
      local_78 = (long *)*plVar11;
    }
    local_70 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    paVar2 = &local_a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)local_80);
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)&local_a8);
    GetOption(this,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_80->DisplayName);
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)&local_a8);
    bVar6 = IsOn(this,&local_a8);
    local_80->field_0x48 = local_80->field_0x48 & 0xfd | bVar6 * '\x02';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)&local_a8);
    bVar6 = IsOn(this,&local_a8);
    local_80->field_0x48 = local_80->field_0x48 & 0xfe | bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)&local_a8);
    bVar6 = IsOn(this,&local_a8);
    local_80->field_0x48 = local_80->field_0x48 & 0xfb | bVar6 << 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)&local_a8);
    bVar6 = IsOn(this,&local_a8);
    if (bVar6) {
      local_80->field_0x48 = local_80->field_0x48 | 8;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CPACK_DOWNLOAD_ALL","");
      cVar12 = GetOption(this,&local_50);
      if (cVar12.Value == (string *)0x0) {
        bVar8 = 0;
      }
      else {
        value._M_str = extraout_RDX;
        value._M_len = (size_t)((cVar12.Value)->_M_dataplus)._M_p;
        bVar7 = cmValue::IsOn((cmValue *)(cVar12.Value)->_M_string_length,value);
        bVar8 = bVar7 << 3;
      }
      local_80->field_0x48 = local_80->field_0x48 & 0xf7 | bVar8;
      if ((!bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)&local_a8);
    cVar12 = GetOption(this,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((cVar12.Value != (string *)0x0) && ((cVar12.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&local_80->ArchiveFile);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)&local_a8);
    cVar12 = GetOption(this,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((cVar12.Value != (string *)0x0) && ((cVar12.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&local_80->Plist);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)&local_a8);
    psVar13 = (string *)GetOption(this,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((psVar13 == (string *)0x0) || (psVar13->_M_string_length == 0)) {
      local_80->Group = (cmCPackComponentGroup *)0x0;
    }
    else {
      if (psVar13 == (string *)0x0) {
        psVar13 = &cmValue::Empty_abi_cxx11_;
      }
      iVar9 = (*this->_vptr_cmCPackGenerator[0x1c])(this,projectName,psVar13);
      pcVar14 = (cmCPackComponentGroup *)CONCAT44(extraout_var,iVar9);
      local_80->Group = pcVar14;
      iVar3._M_current =
           (pcVar14->Components).
           super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pcVar14->Components).
          super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
        _M_realloc_insert<cmCPackComponent*const&>
                  ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                   &pcVar14->Components,iVar3,&local_80);
      }
      else {
        *iVar3._M_current = local_80;
        pppcVar1 = &(pcVar14->Components).
                    super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)&local_a8);
    cVar12 = GetOption(this,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((cVar12.Value != (string *)0x0) && ((cVar12.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&local_80->Description);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)&local_a8);
    cVar12 = GetOption(this,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((cVar12.Value != (string *)0x0) && ((cVar12.Value)->_M_string_length != 0)) {
      if (cVar12.Value == (string *)0x0) {
        local_a8._M_dataplus._M_p = (pointer)0x0;
        local_a8._M_string_length = 0;
        local_a8.field_2._M_allocated_capacity = 0;
      }
      else {
        arg._M_str = ((cVar12.Value)->_M_dataplus)._M_p;
        arg._M_len = (cVar12.Value)->_M_string_length;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_a8,arg,false);
      }
      sVar4 = local_a8._M_string_length;
      if (local_a8._M_dataplus._M_p != (pointer)local_a8._M_string_length) {
        _Var16._M_p = local_a8._M_dataplus._M_p;
        do {
          pcVar5 = local_80;
          iVar9 = (*this->_vptr_cmCPackGenerator[0x1a])(this,projectName,_Var16._M_p);
          local_58 = (cmCPackComponent *)CONCAT44(extraout_var_00,iVar9);
          std::vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>::
          emplace_back<cmCPackInstallationType*>
                    ((vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>> *)
                     &pcVar5->InstallationTypes,(cmCPackInstallationType **)&local_58);
          _Var16._M_p = _Var16._M_p + 0x20;
        } while (_Var16._M_p != (pointer)sVar4);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)&local_a8);
    cVar12 = GetOption(this,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((cVar12.Value != (string *)0x0) && ((cVar12.Value)->_M_string_length != 0)) {
      if (cVar12.Value == (string *)0x0) {
        local_a8._M_dataplus._M_p = (pointer)0x0;
        local_a8._M_string_length = 0;
        local_a8.field_2._M_allocated_capacity = 0;
      }
      else {
        arg_00._M_str = ((cVar12.Value)->_M_dataplus)._M_p;
        arg_00._M_len = (cVar12.Value)->_M_string_length;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_a8,arg_00,false);
      }
      sVar4 = local_a8._M_string_length;
      if (local_a8._M_dataplus._M_p != (pointer)local_a8._M_string_length) {
        _Var16._M_p = local_a8._M_dataplus._M_p;
        do {
          iVar9 = (*this->_vptr_cmCPackGenerator[0x1b])(this,projectName,_Var16._M_p);
          local_58 = (cmCPackComponent *)CONCAT44(extraout_var_01,iVar9);
          iVar3._M_current =
               (local_80->Dependencies).
               super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (local_80->Dependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
            _M_realloc_insert<cmCPackComponent*const&>
                      ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                       &local_80->Dependencies,iVar3,&local_58);
          }
          else {
            *iVar3._M_current = local_58;
            pppcVar1 = &(local_80->Dependencies).
                        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
          iVar3._M_current =
               (local_58->ReverseDependencies).
               super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (local_58->ReverseDependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
            _M_realloc_insert<cmCPackComponent*const&>
                      ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                       &local_58->ReverseDependencies,iVar3,&local_80);
          }
          else {
            *iVar3._M_current = local_80;
            pppcVar1 = &(local_58->ReverseDependencies).
                        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
          _Var16._M_p = _Var16._M_p + 0x20;
        } while (_Var16._M_p != (pointer)sVar4);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
  }
  return local_80;
}

Assistant:

cmCPackComponent* cmCPackGenerator::GetComponent(
  const std::string& projectName, const std::string& name)
{
  bool hasComponent = this->Components.count(name) != 0;
  cmCPackComponent* component = &this->Components[name];
  if (!hasComponent) {
    // Define the component
    std::string macroPrefix =
      "CPACK_COMPONENT_" + cmsys::SystemTools::UpperCase(name);
    component->Name = name;
    cmValue displayName = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (cmNonempty(displayName)) {
      component->DisplayName = *displayName;
    } else {
      component->DisplayName = component->Name;
    }
    component->IsHidden = this->IsOn(macroPrefix + "_HIDDEN");
    component->IsRequired = this->IsOn(macroPrefix + "_REQUIRED");
    component->IsDisabledByDefault = this->IsOn(macroPrefix + "_DISABLED");
    component->IsDownloaded = this->IsOn(macroPrefix + "_DOWNLOADED") ||
      cmIsOn(this->GetOption("CPACK_DOWNLOAD_ALL"));

    cmValue archiveFile = this->GetOption(macroPrefix + "_ARCHIVE_FILE");
    if (cmNonempty(archiveFile)) {
      component->ArchiveFile = *archiveFile;
    }

    cmValue plist = this->GetOption(macroPrefix + "_PLIST");
    if (cmNonempty(plist)) {
      component->Plist = *plist;
    }

    cmValue groupName = this->GetOption(macroPrefix + "_GROUP");
    if (cmNonempty(groupName)) {
      component->Group = this->GetComponentGroup(projectName, groupName);
      component->Group->Components.push_back(component);
    } else {
      component->Group = nullptr;
    }

    cmValue description = this->GetOption(macroPrefix + "_DESCRIPTION");
    if (cmNonempty(description)) {
      component->Description = *description;
    }

    // Determine the installation types.
    cmValue installTypes = this->GetOption(macroPrefix + "_INSTALL_TYPES");
    if (cmNonempty(installTypes)) {
      std::vector<std::string> installTypesVector =
        cmExpandedList(installTypes);
      for (std::string const& installType : installTypesVector) {
        component->InstallationTypes.push_back(
          this->GetInstallationType(projectName, installType));
      }
    }

    // Determine the component dependencies.
    cmValue depends = this->GetOption(macroPrefix + "_DEPENDS");
    if (cmNonempty(depends)) {
      std::vector<std::string> dependsVector = cmExpandedList(depends);
      for (std::string const& depend : dependsVector) {
        cmCPackComponent* child = this->GetComponent(projectName, depend);
        component->Dependencies.push_back(child);
        child->ReverseDependencies.push_back(component);
      }
    }
  }
  return component;
}